

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

void __thiscall CommandLineParser::readNonOptionCommands(CommandLineParser *this)

{
  bool bVar1;
  int iVar2;
  string local_1e0;
  PlugInParameters local_1c0 [40];
  string local_198;
  string local_178 [8];
  string parameters;
  string local_138 [32];
  string local_118;
  string local_f8;
  int local_d4;
  undefined1 local_d0 [4];
  int indexParameter;
  CommandLinePlugInInfo plugIn;
  string local_68 [55];
  allocator<char> local_31;
  string local_30;
  CommandLineParser *local_10;
  CommandLineParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,":",&local_31);
  bVar1 = argumentStartsWith(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (bVar1) {
    getNextArgument_abi_cxx11_((string *)&plugIn.field_0x40,this);
    std::__cxx11::string::substr((ulong)local_68,(ulong)&plugIn.field_0x40);
    std::__cxx11::string::operator=((string *)&this->m_testPath,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&plugIn.field_0x40);
  }
  else {
    CommandLinePlugInInfo::CommandLinePlugInInfo((CommandLinePlugInInfo *)local_d0);
    getCurrentArgument_abi_cxx11_(&local_f8,this);
    iVar2 = std::__cxx11::string::find((char)&local_f8,0x3d);
    std::__cxx11::string::~string((string *)&local_f8);
    local_d4 = iVar2;
    if (iVar2 < 0) {
      getCurrentArgument_abi_cxx11_(&local_118,this);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      getCurrentArgument_abi_cxx11_((string *)((long)&parameters.field_2 + 8),this);
      std::__cxx11::string::substr((ulong)local_138,(ulong)((long)&parameters.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_d0,local_138);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string((string *)(parameters.field_2._M_local_buf + 8));
      getCurrentArgument_abi_cxx11_(&local_198,this);
      std::__cxx11::string::substr((ulong)local_178,(ulong)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      CppUnit::PlugInParameters::PlugInParameters(local_1c0,local_178);
      CppUnit::PlugInParameters::operator=
                ((PlugInParameters *)(plugIn.m_fileName.field_2._M_local_buf + 8),local_1c0);
      CppUnit::PlugInParameters::~PlugInParameters(local_1c0);
      std::__cxx11::string::~string(local_178);
    }
    std::deque<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::push_back
              (&this->m_plugIns,(value_type *)local_d0);
    getNextArgument_abi_cxx11_(&local_1e0,this);
    std::__cxx11::string::~string((string *)&local_1e0);
    CommandLinePlugInInfo::~CommandLinePlugInInfo((CommandLinePlugInInfo *)local_d0);
  }
  return;
}

Assistant:

void 
CommandLineParser::readNonOptionCommands()
{
  if ( argumentStartsWith( ":" ) )
    m_testPath = getNextArgument().substr( 1 );
  else
  {
    CommandLinePlugInInfo plugIn;
    int indexParameter = getCurrentArgument().find( '=' );
    if ( indexParameter < 0 )
      plugIn.m_fileName = getCurrentArgument();
    else
    {
      plugIn.m_fileName = getCurrentArgument().substr( 0, indexParameter );
      std::string parameters = getCurrentArgument().substr( indexParameter +1 );
      plugIn.m_parameters = CPPUNIT_NS::PlugInParameters( parameters );
    }
    
    m_plugIns.push_back( plugIn );

    getNextArgument();
  }
}